

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmp_message.c
# Opt level: O0

int yabmp_vsnprintf(char *buffer,int buffer_size,char *format,__va_list_tag *args)

{
  char cVar1;
  ulong uVar2;
  uint *puVar3;
  uint uVar4;
  char *pcVar5;
  __va_list_tag *p_Var6;
  __va_list_tag *p_Var7;
  uint *local_e8;
  ulong *local_d0;
  ulong *local_b8;
  size_t *local_a0;
  uint local_7c;
  int digit_2;
  uint digits_2;
  uint value_2;
  int digit_1;
  unsigned_long digits_1;
  unsigned_long value_1;
  ulong uStack_58;
  int digit;
  size_t digits;
  size_t value;
  char *ptr;
  char *pcStack_38;
  int c;
  char *current;
  char *end;
  __va_list_tag *args_local;
  char *format_local;
  int buffer_size_local;
  char *buffer_local;
  
  pcVar5 = buffer + buffer_size;
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                  ,0x60,"int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  if (buffer_size < 1) {
    __assert_fail("buffer_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                  ,0x61,"int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  pcStack_38 = buffer;
  args_local = (__va_list_tag *)format;
  if (format == (char *)0x0) {
    __assert_fail("format != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                  ,0x62,"int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              p_Var6 = (__va_list_tag *)((long)&args_local->gp_offset + 1);
              cVar1 = (char)args_local->gp_offset;
              if (cVar1 == '\0' || pcVar5 <= pcStack_38) {
                if (pcStack_38 == pcVar5) {
                  pcStack_38[-1] = '\0';
                }
                else {
                  *pcStack_38 = '\0';
                }
                return (int)pcStack_38 - (int)buffer;
              }
              if (cVar1 == '%') break;
              *pcStack_38 = cVar1;
              pcStack_38 = pcStack_38 + 1;
              args_local = p_Var6;
            }
            p_Var7 = (__va_list_tag *)((long)&args_local->gp_offset + 2);
            cVar1 = (char)p_Var6->gp_offset;
            if (cVar1 != '%') break;
            *pcStack_38 = '%';
            pcStack_38 = pcStack_38 + 1;
            args_local = p_Var7;
          }
          if (cVar1 != 'l') break;
          puVar3 = &args_local->gp_offset;
          if ((char)p_Var7->gp_offset != 'u') {
            __assert_fail("c == \'u\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                          ,0x80,
                          "int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
          }
          uVar4 = args->gp_offset;
          if (uVar4 < 0x29) {
            local_d0 = (ulong *)((long)(int)uVar4 + (long)args->reg_save_area);
            args->gp_offset = uVar4 + 8;
          }
          else {
            local_d0 = (ulong *)args->overflow_arg_area;
            args->overflow_arg_area = local_d0 + 1;
          }
          digits_1 = *local_d0;
          for (_value_2 = 1; 9 < digits_1 / _value_2; _value_2 = _value_2 * 10) {
          }
          while (args_local = (__va_list_tag *)((long)puVar3 + 3),
                _value_2 != 0 && pcStack_38 < pcVar5) {
            uVar2 = digits_1 / _value_2;
            digits_1 = digits_1 % _value_2;
            _value_2 = _value_2 / 10;
            *pcStack_38 = (char)uVar2 + '0';
            pcStack_38 = pcStack_38 + 1;
          }
        }
        if (cVar1 != 's') break;
        uVar4 = args->gp_offset;
        if (uVar4 < 0x29) {
          local_a0 = (size_t *)((long)(int)uVar4 + (long)args->reg_save_area);
          args->gp_offset = uVar4 + 8;
        }
        else {
          local_a0 = (size_t *)args->overflow_arg_area;
          args->overflow_arg_area = local_a0 + 1;
        }
        value = *local_a0;
        if (value == 0) {
          value = (size_t)anon_var_dwarf_149e;
        }
        while( true ) {
          args_local = p_Var7;
          if (*(char *)value == '\0' || pcVar5 <= pcStack_38) break;
          *pcStack_38 = *(char *)value;
          value = value + 1;
          pcStack_38 = pcStack_38 + 1;
        }
      }
      if (cVar1 != 'u') break;
      uVar4 = args->gp_offset;
      if (uVar4 < 0x29) {
        local_e8 = (uint *)((long)(int)uVar4 + (long)args->reg_save_area);
        args->gp_offset = uVar4 + 8;
      }
      else {
        local_e8 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = local_e8 + 2;
      }
      digit_2 = *local_e8;
      for (local_7c = 1; 9 < (uint)digit_2 / local_7c; local_7c = local_7c * 10) {
      }
      while (args_local = p_Var7, local_7c != 0 && pcStack_38 < pcVar5) {
        uVar4 = (uint)digit_2 / local_7c;
        digit_2 = (uint)digit_2 % local_7c;
        local_7c = local_7c / 10;
        *pcStack_38 = (char)uVar4 + '0';
        pcStack_38 = pcStack_38 + 1;
      }
    }
    if (cVar1 != 'z') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                    ,0x8d,"int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    args_local = (__va_list_tag *)((long)&args_local->gp_offset + 3);
    if ((char)p_Var7->gp_offset != 'u') break;
    uVar4 = args->gp_offset;
    if (uVar4 < 0x29) {
      local_b8 = (ulong *)((long)(int)uVar4 + (long)args->reg_save_area);
      args->gp_offset = uVar4 + 8;
    }
    else {
      local_b8 = (ulong *)args->overflow_arg_area;
      args->overflow_arg_area = local_b8 + 1;
    }
    digits = *local_b8;
    for (uStack_58 = 1; 9 < digits / uStack_58; uStack_58 = uStack_58 * 10) {
    }
    while (uStack_58 != 0 && pcStack_38 < pcVar5) {
      uVar2 = digits / uStack_58;
      digits = digits % uStack_58;
      uStack_58 = uStack_58 / 10;
      *pcStack_38 = (char)uVar2 + '0';
      pcStack_38 = pcStack_38 + 1;
    }
  }
  __assert_fail("c == \'u\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/lib/yabmp/src/yabmp_message.c"
                ,0x78,"int yabmp_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
}

Assistant:

static int yabmp_vsnprintf(char * buffer, int buffer_size, const char * format, va_list args )
{
	char* end = buffer + buffer_size;
	char* current = buffer;
	int c;
	
	assert(buffer != NULL);
	assert(buffer_size > 0);
	assert(format != NULL);
	
	while (((c = *format++) != '\0') && (current < end)) {
		if (c == '%') {
			c = *format++;
			switch (c) {
				case '%':
					*current++ = (char)c;
					break;
				case 's':
					{
						const char* ptr = va_arg(args, const char*);
						if (ptr == NULL) {
							ptr = "(null)";
						}
						while (((c = *ptr++) != '\0') && (current < end)) {
							*current++ = (char)c;
						}
					}
					break;
				case 'z':
					c = *format++;
					assert(c == 'u');
					{
						size_t value = va_arg(args, size_t);
						PRINT_UINT(size_t);
					}
					break;
				case 'l':
					c = *format++;
					assert(c == 'u');
					{
						unsigned long value = va_arg(args, unsigned long);
						PRINT_UINT(unsigned long);
					}
					break;
				case 'u':
					{
						unsigned int value = va_arg(args, unsigned int);
						PRINT_UINT(unsigned int);
					}
					break;
				default:
					assert(0);
					current = end;
					break;
			}
		} else {
			*current++ = (char)c;
		}
	}
	
	if (current == end) {
		current[-1] = '\0';
	} else {
		*current = '\0';
	}
	return (int)(current - buffer);
}